

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall FHealthBar::MakeTexture(FHealthBar *this)

{
  BYTE BVar1;
  BYTE BVar2;
  uint uVar3;
  int i;
  long lVar4;
  int i_1;
  ulong uVar5;
  
  uVar3 = this->VialLevel;
  if ((ulong)uVar3 == 999) {
    BVar1 = this->Colors[4];
    BVar2 = this->Colors[5];
    lVar4 = 0;
    do {
      (&(this->super_FTexture).field_0x54)[lVar4 * 2] = BVar1;
      (&(this->super_FTexture).field_0x55)[lVar4 * 2] = BVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 200);
  }
  else if ((int)uVar3 < 0x65) {
    if ((int)uVar3 < 0xb) {
      if (0 < (int)uVar3) {
        BVar1 = this->Colors[6];
        BVar2 = this->Colors[7];
        lVar4 = 0;
        do {
          (&(this->super_FTexture).field_0x54)[lVar4 * 2] = BVar1;
          (&(this->super_FTexture).field_0x55)[lVar4 * 2] = BVar2;
          lVar4 = lVar4 + 1;
        } while ((ulong)uVar3 * 2 != lVar4);
      }
    }
    else if ((int)uVar3 < 0x15) {
      BVar1 = this->Colors[4];
      BVar2 = this->Colors[5];
      uVar5 = 0;
      do {
        (&(this->super_FTexture).field_0x54)[uVar5 * 2] = BVar1;
        (&(this->super_FTexture).field_0x55)[uVar5 * 2] = BVar2;
        uVar5 = uVar5 + 1;
      } while (uVar3 * 2 != uVar5);
    }
    else {
      BVar1 = this->Colors[0];
      BVar2 = this->Colors[1];
      uVar5 = 0;
      do {
        (&(this->super_FTexture).field_0x54)[uVar5 * 2] = BVar1;
        (&(this->super_FTexture).field_0x55)[uVar5 * 2] = BVar2;
        uVar5 = uVar5 + 1;
      } while (uVar3 * 2 != uVar5);
    }
    if (this->VialLevel < 100) {
      lVar4 = (long)(this->VialLevel * 2);
      memset(&(this->super_FTexture).field_0x54 + lVar4 * 2,0,lVar4 * -2 + 400);
      return;
    }
  }
  else {
    uVar3 = uVar3 * -2 + 400;
    if (0 < (int)uVar3) {
      BVar1 = this->Colors[0];
      BVar2 = this->Colors[1];
      uVar5 = 0;
      do {
        (&(this->super_FTexture).field_0x54)[uVar5 * 2] = BVar1;
        (&(this->super_FTexture).field_0x55)[uVar5 * 2] = BVar2;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    if ((int)uVar3 < 200) {
      BVar1 = this->Colors[2];
      BVar2 = this->Colors[3];
      lVar4 = (long)(int)uVar3;
      do {
        (&(this->super_FTexture).field_0x54)[lVar4 * 2] = BVar1;
        (&(this->super_FTexture).field_0x55)[lVar4 * 2] = BVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 200);
    }
  }
  return;
}

Assistant:

void FHealthBar::MakeTexture ()
{
	if (VialLevel == 999)
	{
		FillBar (0, 100, Colors[4], Colors[5]);
	}
	else
	{
		if (VialLevel <= 100)
		{
			if (VialLevel <= 10)
			{
				FillBar (0, VialLevel, Colors[6], Colors[7]);
			}
			else if (VialLevel <= 20)
			{
				FillBar (0, VialLevel, Colors[4], Colors[5]);
			}
			else
			{
				FillBar (0, VialLevel, Colors[0], Colors[1]);
			}
			FillBar (VialLevel, 100, 0, 0);
		}
		else
		{
			int stop = 100 - (VialLevel - 100);
			FillBar (0, stop, Colors[0], Colors[1]);
			FillBar (stop, 100, Colors[2], Colors[3]);
		}
	}
}